

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * operator+=(QString *a,
                    QStringBuilder<QStringBuilder<const_QLatin1String_&,_QString>,_char16_t> *b)

{
  ArrayOptions *pAVar1;
  __atomic_base<int> _Var2;
  Data *pDVar3;
  long lVar4;
  long lVar5;
  QChar *pQVar6;
  QLatin1String *pQVar7;
  QAbstractConcatenable *this;
  QChar *out;
  long lVar8;
  QChar *alloc;
  char16_t *pcVar9;
  char16_t *pcVar10;
  QLatin1StringView in;
  
  pDVar3 = (a->d).d;
  lVar8 = (a->d).size;
  lVar4 = (b->a).b.d.size;
  lVar5 = ((b->a).a)->m_size;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData(a,lVar8,KeepSize);
  }
  out = (QChar *)(lVar4 + lVar5 + lVar8 + 1);
  pDVar3 = (a->d).d;
  if (pDVar3 == (Data *)0x0) {
    lVar8 = 0;
  }
  else {
    lVar8 = (pDVar3->super_QArrayData).alloc -
            (((long)((long)(a->d).ptr -
                    ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
             1) + (a->d).size);
  }
  if (lVar8 < (long)out) {
    if (pDVar3 == (Data *)0x0) {
      alloc = (QChar *)0x0;
    }
    else {
      alloc = (QChar *)((pDVar3->super_QArrayData).alloc * 2);
    }
    if ((long)alloc < (long)out) {
      alloc = out;
    }
    if (((pDVar3 == (Data *)0x0) ||
        (_Var2._M_i = (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i,
        out = (QChar *)(ulong)(uint)_Var2._M_i, 1 < _Var2._M_i)) ||
       (out = (QChar *)((pDVar3->super_QArrayData).alloc -
                       ((long)((long)(a->d).ptr -
                              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) &
                              0xfffffffffffffff0)) >> 1)), (long)out <= (long)alloc)) {
      pQVar6 = (QChar *)(a->d).size;
      if ((long)alloc < (long)pQVar6) {
        alloc = pQVar6;
      }
      QString::reallocData(a,(qsizetype)alloc,KeepSize);
    }
    pDVar3 = (a->d).d;
    if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar3->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  pDVar3 = (a->d).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData(a,(a->d).size,KeepSize);
  }
  pcVar10 = (a->d).ptr + (a->d).size;
  pQVar7 = (b->a).a;
  this = (QAbstractConcatenable *)pQVar7->m_size;
  in.m_data = (char *)pcVar10;
  in.m_size = (qsizetype)pQVar7->m_data;
  QAbstractConcatenable::appendLatin1To(this,in,out);
  pcVar10 = pcVar10 + (long)this;
  lVar8 = (b->a).b.d.size;
  if (lVar8 != 0) {
    pcVar9 = (b->a).b.d.ptr;
    if (pcVar9 == (char16_t *)0x0) {
      pcVar9 = L"";
    }
    memcpy(pcVar10,pcVar9,lVar8 * 2);
  }
  pcVar10[lVar8] = b->b;
  pcVar9 = (a->d).ptr;
  if (pcVar9 == (char16_t *)0x0) {
    pcVar9 = L"";
  }
  QString::resize(a,(long)(pcVar10 + lVar8) + (2 - (long)pcVar9) >> 1);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}